

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dev_data.c
# Opt level: O0

void DispFootGroundingData(FootStatus_t FootGrounding)

{
  FootStatus_t FootGrounding_local;
  
  if ((FootGrounding & 1) == 0) {
    printf(" LF ");
  }
  else {
    printf("[LF]");
  }
  if ((FootGrounding & 2) == 0) {
    printf(" RH ");
  }
  else {
    printf("[RH]");
  }
  if ((FootGrounding & 4) == 0) {
    printf(" RF ");
  }
  else {
    printf("[RF]");
  }
  if ((FootGrounding & 8) == 0) {
    printf(" LH ");
  }
  else {
    printf("[LH]");
  }
  printf("\n");
  return;
}

Assistant:

void DispFootGroundingData(FootStatus_t FootGrounding)
{
	if (FootGrounding & 0x01)
		printf("[LF]");
	else
		printf(" LF ");

	if (FootGrounding & 0x02)
		printf("[RH]");
	else
		printf(" RH ");

	if (FootGrounding & 0x04)
		printf("[RF]");
	else
		printf(" RF ");

	if (FootGrounding & 0x08)
		printf("[LH]");
	else
		printf(" LH ");

	printf("\n");
}